

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# secp256k1.c
# Opt level: O0

void secp256k1_context_destroy(secp256k1_context *ctx)

{
  secp256k1_context *ctx_local;
  
  if (ctx != (secp256k1_context *)0x0) {
    secp256k1_context_preallocated_destroy(ctx);
    free(ctx);
  }
  return;
}

Assistant:

void secp256k1_context_destroy(secp256k1_context* ctx) {
    if (ctx != NULL) {
        secp256k1_context_preallocated_destroy(ctx);
        free(ctx);
    }
}